

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O1

int ARGBSepia(uint8_t *dst_argb,int dst_stride_argb,int dst_x,int dst_y,int width,int height)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  int iVar4;
  code *pcVar5;
  int iVar6;
  uint8_t *puVar7;
  bool bVar8;
  
  iVar4 = -1;
  iVar2 = -1;
  if ((((-1 < (dst_y | dst_x)) && (iVar2 = iVar4, dst_argb != (uint8_t *)0x0)) && (0 < width)) &&
     (0 < height)) {
    bVar8 = width * 4 != dst_stride_argb;
    iVar4 = 0;
    if (bVar8) {
      iVar4 = dst_stride_argb;
    }
    iVar6 = 1;
    if (!bVar8) {
      iVar6 = height;
    }
    if (!bVar8) {
      height = 1;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    pcVar3 = ARGBSepiaRow_C;
    if ((iVar6 * width & 7U) == 0) {
      pcVar3 = ARGBSepiaRow_SSSE3;
    }
    pcVar5 = ARGBSepiaRow_C;
    if ((uVar1 & 0x40) != 0) {
      pcVar5 = pcVar3;
    }
    iVar2 = 0;
    if (0 < height) {
      puVar7 = dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2);
      do {
        (*pcVar5)(puVar7,iVar6 * width);
        puVar7 = puVar7 + iVar4;
        height = height + -1;
      } while (height != 0);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

LIBYUV_API
int ARGBSepia(uint8_t* dst_argb,
              int dst_stride_argb,
              int dst_x,
              int dst_y,
              int width,
              int height) {
  int y;
  void (*ARGBSepiaRow)(uint8_t * dst_argb, int width) = ARGBSepiaRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || width <= 0 || height <= 0 || dst_x < 0 || dst_y < 0) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_ARGBSEPIAROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 8)) {
    ARGBSepiaRow = ARGBSepiaRow_SSSE3;
  }
#endif
#if defined(HAS_ARGBSEPIAROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBSepiaRow = ARGBSepiaRow_NEON;
  }
#endif
#if defined(HAS_ARGBSEPIAROW_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(width, 2)) {
    ARGBSepiaRow = ARGBSepiaRow_MMI;
  }
#endif
#if defined(HAS_ARGBSEPIAROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBSepiaRow = ARGBSepiaRow_MSA;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBSepiaRow(dst, width);
    dst += dst_stride_argb;
  }
  return 0;
}